

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt;
  htmlDocPtr pxVar1;
  
  xmlInitParser();
  ctxt = htmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    pxVar1 = htmlDoRead(ctxt,URL,encoding,options,0);
    return pxVar1;
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = htmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}